

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O3

void __thiscall
TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test::TestBody
          (TwoConnections_SyncOnSecondConnectionMapsAdditionalSpace_Test *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  element_type *peVar3;
  undefined8 uVar4;
  void *__s;
  void *pvVar5;
  value_type_conflict2 *__val;
  pointer *__ptr;
  char *message;
  ptrdiff_t _Num;
  database *this_00;
  size_t __n;
  char cVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar28;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  extent<unsigned_char> t1;
  shared_ptr<const_unsigned_char> r;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer2;
  pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> local_f8;
  AssertHelper local_e0;
  undefined1 local_d8 [16];
  pointer local_c8;
  char local_b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [24];
  undefined1 local_90 [16];
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> local_80;
  long lVar10;
  
  __s = operator_new(0x400001);
  lVar7 = 0;
  memset(__s,0,0x400001);
  auVar2 = _DAT_002116f0;
  auVar9 = _DAT_00211660;
  auVar11 = _DAT_00211670;
  auVar12 = _DAT_00211680;
  auVar13 = _DAT_00211690;
  auVar14 = _DAT_002116a0;
  auVar15 = _DAT_002116b0;
  auVar16 = _DAT_002116c0;
  auVar17 = _DAT_002116d0;
  do {
    auVar19 = auVar17 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar29._4_4_ = iVar18;
    auVar29._0_4_ = iVar18;
    auVar29._8_4_ = iVar28;
    auVar29._12_4_ = iVar28;
    auVar37._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar37._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar37._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar37._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar20._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar20._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar20._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar20._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar20 = auVar20 & auVar37;
    auVar19 = pshuflw(auVar29,auVar20,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    cVar6 = (char)lVar7;
    if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)((long)__s + lVar7) = cVar6;
    }
    auVar19 = packssdw(auVar20,auVar20);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._0_4_ >> 8 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 1) = cVar6 + '\x01';
    }
    auVar19 = auVar16 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar30._4_4_ = iVar18;
    auVar30._0_4_ = iVar18;
    auVar30._8_4_ = iVar28;
    auVar30._12_4_ = iVar28;
    auVar38._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar38._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar38._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar38._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar21._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar38;
    auVar19 = packssdw(auVar30,auVar21);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._0_4_ >> 0x10 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 2) = cVar6 + '\x02';
    }
    auVar19 = pshufhw(auVar21,auVar21,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._0_4_ >> 0x18 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 3) = cVar6 + '\x03';
    }
    auVar19 = auVar15 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar31._4_4_ = iVar18;
    auVar31._0_4_ = iVar18;
    auVar31._8_4_ = iVar28;
    auVar31._12_4_ = iVar28;
    auVar39._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar39._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar39._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar39._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar22._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar39;
    auVar19 = pshuflw(auVar31,auVar22,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)((long)__s + lVar7 + 4) = cVar6 + '\x04';
    }
    auVar19 = packssdw(auVar22,auVar22);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._4_2_ >> 8 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 5) = cVar6 + '\x05';
    }
    auVar19 = auVar14 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar32._4_4_ = iVar18;
    auVar32._0_4_ = iVar18;
    auVar32._8_4_ = iVar28;
    auVar32._12_4_ = iVar28;
    auVar40._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar40._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar40._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar40._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar23._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar40;
    auVar19 = packssdw(auVar32,auVar23);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)((long)__s + lVar7 + 6) = cVar6 + '\x06';
    }
    auVar19 = pshufhw(auVar23,auVar23,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._6_2_ >> 8 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 7) = cVar6 + '\a';
    }
    auVar19 = auVar13 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar33._4_4_ = iVar18;
    auVar33._0_4_ = iVar18;
    auVar33._8_4_ = iVar28;
    auVar33._12_4_ = iVar28;
    auVar41._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar41._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar41._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar41._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar24._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar41;
    auVar19 = pshuflw(auVar33,auVar24,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(char *)((long)__s + lVar7 + 8) = cVar6 + '\b';
    }
    auVar19 = packssdw(auVar24,auVar24);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._8_2_ >> 8 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 9) = cVar6 + '\t';
    }
    auVar19 = auVar12 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar34._4_4_ = iVar18;
    auVar34._0_4_ = iVar18;
    auVar34._8_4_ = iVar28;
    auVar34._12_4_ = iVar28;
    auVar42._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar42._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar42._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar42._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar25._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar42;
    auVar19 = packssdw(auVar34,auVar25);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      *(char *)((long)__s + lVar7 + 10) = cVar6 + '\n';
    }
    auVar19 = pshufhw(auVar25,auVar25,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._10_2_ >> 8 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 0xb) = cVar6 + '\v';
    }
    auVar19 = auVar11 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar35._4_4_ = iVar18;
    auVar35._0_4_ = iVar18;
    auVar35._8_4_ = iVar28;
    auVar35._12_4_ = iVar28;
    auVar43._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar43._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar43._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar43._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar26._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar26._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar26._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar26._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar26 = auVar26 & auVar43;
    auVar19 = pshuflw(auVar35,auVar26,0xe8);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      *(char *)((long)__s + lVar7 + 0xc) = cVar6 + '\f';
    }
    auVar19 = packssdw(auVar26,auVar26);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._12_2_ >> 8 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 0xd) = cVar6 + '\r';
    }
    auVar19 = auVar9 ^ auVar2;
    iVar18 = auVar19._0_4_;
    iVar28 = auVar19._8_4_;
    auVar36._4_4_ = iVar18;
    auVar36._0_4_ = iVar18;
    auVar36._8_4_ = iVar28;
    auVar36._12_4_ = iVar28;
    auVar44._0_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar44._4_4_ = -(uint)(iVar18 < -0x7fbfffff);
    auVar44._8_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar44._12_4_ = -(uint)(iVar28 < -0x7fbfffff);
    auVar27._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar44;
    auVar19 = packssdw(auVar36,auVar27);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      *(char *)((long)__s + lVar7 + 0xe) = cVar6 + '\x0e';
    }
    auVar19 = pshufhw(auVar27,auVar27,0x84);
    auVar19 = packssdw(auVar19,auVar19);
    auVar19 = packsswb(auVar19,auVar19);
    if ((auVar19._14_2_ >> 8 & 1) != 0) {
      *(char *)((long)__s + lVar7 + 0xf) = cVar6 + '\x0f';
    }
    lVar7 = lVar7 + 0x10;
    lVar10 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 0x10;
    auVar17._8_8_ = lVar10 + 0x10;
    lVar10 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 0x10;
    auVar16._8_8_ = lVar10 + 0x10;
    lVar10 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 0x10;
    auVar15._8_8_ = lVar10 + 0x10;
    lVar10 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 0x10;
    auVar14._8_8_ = lVar10 + 0x10;
    lVar10 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 0x10;
    auVar13._8_8_ = lVar10 + 0x10;
    lVar10 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 0x10;
    auVar12._8_8_ = lVar10 + 0x10;
    lVar10 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 0x10;
    auVar11._8_8_ = lVar10 + 0x10;
    lVar10 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 0x10;
    auVar9._8_8_ = lVar10 + 0x10;
  } while (lVar7 != 0x400010);
  local_a8._0_16_ = (undefined1  [16])0x0;
  pstore::begin((transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)(local_90 + 0x10),
                &(this->super_TwoConnections).first);
  local_a8._8_8_ = &DAT_00400001;
  pstore::transaction_base::alloc_rw<unsigned_char,void>
            (&local_f8,(transaction_base *)(local_90 + 0x10),0x400001);
  local_a8._0_8_ = local_f8.second.a_.a_;
  memcpy(local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__s,
         0x400001);
  if (local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pstore::transaction_base::commit((transaction_base *)(local_90 + 0x10));
  local_80.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0026c668;
  pstore::transaction_base::rollback((transaction_base *)(local_90 + 0x10));
  pstore::lock_guard<pstore::transaction_mutex>::~lock_guard(&local_80.lock_);
  this_00 = &(this->super_TwoConnections).second;
  pstore::database::sync(this_00);
  pstore::database::getro<unsigned_char,void>((database *)local_90,(extent<unsigned_char> *)this_00)
  ;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(local_90 + 0x10),
             (uchar *)local_90._0_8_,(uchar *)(local_a8._8_8_ + local_90._0_8_),
             (allocator_type *)&local_f8);
  pvVar5 = operator_new(0x400001);
  memcpy(pvVar5,__s,0x400001);
  local_d8 = (undefined1  [16])0x0;
  local_c8 = (pointer)0x0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,0x400001);
  uVar4 = local_d8._0_8_;
  memmove((void *)local_d8._0_8_,pvVar5,0x400001);
  local_d8._8_8_ = (pointer)(uVar4 + 0x400001);
  operator_delete(pvVar5,0x400001);
  bVar1 = true;
  uVar8 = local_d8._8_8_ - local_d8._0_8_;
  if (uVar8 == 0) {
    __n = 0;
    pvVar5 = (void *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pvVar5 = operator_new(uVar8);
    __n = local_d8._8_8_ - local_d8._0_8_;
    if (__n != 0) {
      memmove(pvVar5,(void *)local_d8._0_8_,__n);
      bVar1 = false;
    }
  }
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.second.a_.a_ = (address)0;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,__n);
  peVar3 = local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!bVar1) {
    memmove(local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            pvVar5,__n);
  }
  local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(peVar3 + __n);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,uVar8);
  }
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
  ::operator()(local_b8,(char *)&local_f8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)"buffer2");
  if (local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    operator_delete(local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,(long)local_f8.second.a_.a_ -
                           (long)local_f8.first.
                                 super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
  }
  if ((pointer)local_d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d8._0_8_,(long)local_c8 - local_d8._0_8_);
  }
  if (local_b8[0] == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_two_connections.cpp"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)local_f8.first.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (long *)0x0) {
      (**(code **)(*(long *)local_f8.first.
                            super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
                  ))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  if ((element_type *)local_80.super_transaction_base._vptr_transaction_base != (element_type *)0x0)
  {
    operator_delete(local_80.super_transaction_base._vptr_transaction_base,
                    local_80.super_transaction_base.size_ -
                    (long)local_80.super_transaction_base._vptr_transaction_base);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  operator_delete(__s,0x400001);
  return;
}

Assistant:

TEST_F (TwoConnections, SyncOnSecondConnectionMapsAdditionalSpace) {
    using ::testing::ContainerEq;

    // The first connection write > min_region_size bytes in a transaction.
    std::vector<std::uint8_t> buffer1 (pstore::storage::min_region_size + 1);
    std::iota (std::begin (buffer1), std::end (buffer1), std::uint8_t{0});

    pstore::extent<std::uint8_t> t1;
    {
        auto transaction = pstore::begin (first);
        {
            t1.size = buffer1.size ();
            std::shared_ptr<std::uint8_t> ptr;
            std::tie (ptr, t1.addr) = transaction.alloc_rw<std::uint8_t> (t1.size);
            std::memcpy (ptr.get (), buffer1.data (), buffer1.size ());
        }

        transaction.commit ();
    }

    second.sync ();
    auto r = second.getro (t1);
    std::vector<std::uint8_t> buffer2 (r.get (), r.get () + t1.size);
    EXPECT_THAT (buffer2, ContainerEq (buffer1));
}